

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_generator_testing.h
# Opt level: O3

EnumClass __thiscall
phmap::priv::hash_internal::Generator<phmap::priv::hash_internal::EnumClass,_void>::operator()
          (Generator<phmap::priv::hash_internal::EnumClass,_void> *this)

{
  mt19937_64 *__urng;
  EnumClass EVar1;
  uniform_int_distribution<unsigned_long> dist;
  param_type local_18;
  
  local_18._M_a = 0;
  local_18._M_b = 0xffffffffffffffff;
  do {
    __urng = GetSharedRng();
    EVar1 = std::uniform_int_distribution<unsigned_long>::operator()
                      ((uniform_int_distribution<unsigned_long> *)&local_18,__urng,&local_18);
  } while (EVar1 < 2);
  return EVar1;
}

Assistant:

EnumClass operator()() const {
        std::uniform_int_distribution<
            typename std::underlying_type<EnumClass>::type> dist;
        while (true) {
            EnumClass variate = static_cast<EnumClass>(dist(*GetSharedRng()));
            if (variate != EnumClass::kEmpty && variate != EnumClass::kDeleted)
                return static_cast<EnumClass>(variate);
        }
    }